

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O3

bool __thiscall soul::Value::isZero(Value *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  PackedData local_28;
  
  bVar2 = true;
  if (((((this->type).category != invalid) && ((this->allocatedData).allocatedData.numActive != 0))
      && (getData(&local_28,this), ((local_28.type)->primitiveType).type != void_)) &&
     (local_28.size != 0)) {
    lVar1 = 0;
    do {
      bVar2 = local_28.data[lVar1] == '\0';
      if (!bVar2) {
        return bVar2;
      }
      bVar3 = local_28.size - 1 != lVar1;
      lVar1 = lVar1 + 1;
    } while (bVar3);
  }
  return bVar2;
}

Assistant:

StringDictionary::Handle getStringLiteral() const
    {
        SOUL_ASSERT (type.isStringLiteral());
        return getAs<StringDictionary::Handle>();
    }